

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<short,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,short *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  short sVar3;
  float fVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  undefined1 auVar7 [16];
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  short *psVar10;
  short sVar11;
  ImU32 col;
  ImPlotPoint *pIVar12;
  long lVar13;
  short sVar14;
  ImPlotContext *gp;
  long lVar15;
  ulong uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  ImVec4 IVar21;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_170;
  undefined1 local_168 [16];
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  double local_138;
  double local_130;
  short *local_128;
  double local_120;
  double local_118;
  long local_110;
  long local_108;
  ulong local_100;
  double local_f8;
  char *local_f0;
  short *local_e8;
  double local_e0;
  RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLin> local_d8;
  undefined1 local_b8 [56];
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  pIVar8 = GImPlot;
  local_168._8_8_ = local_168._0_8_;
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    sVar14 = *values;
    sVar11 = sVar14;
    if (1 < cols * rows) {
      uVar16 = 1;
      do {
        sVar3 = values[uVar16];
        if (sVar3 < sVar11) {
          sVar11 = sVar3;
        }
        if (sVar3 <= sVar14) {
          sVar3 = sVar14;
        }
        sVar14 = sVar3;
        uVar16 = uVar16 + 1;
      } while ((uint)(cols * rows) != uVar16);
    }
    scale_min = (double)(int)sVar11;
    scale_max = (double)(int)sVar14;
  }
  if ((scale_min != scale_max) || (NAN(scale_min) || NAN(scale_max))) {
    if (reverse_y) {
      dVar20 = -1.0;
      pIVar12 = bounds_max;
    }
    else {
      dVar20 = 1.0;
      pIVar12 = bounds_min;
    }
    local_168._0_8_ = (undefined8)cols;
    local_168._8_8_ = (undefined8)rows;
    local_120 = pIVar12->y;
    local_b8._8_4_ = cols * rows;
    local_80 = bounds_min->x;
    auVar19._0_8_ = bounds_max->x - local_80;
    auVar19._8_8_ = bounds_max->y - bounds_min->y;
    auVar7._8_8_ = local_168._8_8_;
    auVar7._0_8_ = local_168._0_8_;
    local_b8._40_16_ = divpd(auVar19,auVar7);
    local_68 = local_b8._40_8_ * 0.5;
    dStack_60 = local_b8._48_8_ * 0.5;
    pIVar5 = GImPlot->CurrentPlot;
    fVar4 = (float)pIVar5->CurrentYAxis;
    local_b8._0_8_ = values;
    local_b8._12_4_ = rows;
    local_b8._16_4_ = cols;
    local_b8._24_8_ = scale_min;
    local_b8._32_8_ = scale_max;
    local_78 = local_120;
    local_70 = dVar20;
    switch(GImPlot->Scales[(int)fVar4]) {
    case 0:
      local_d8.Transformer = (TransformerLinLin *)&local_170;
      local_170.x = fVar4;
      local_d8.Getter = (GetterHeatmap<short> *)local_b8;
      local_d8.Prims = local_b8._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,ImPlot::TransformerLinLin>>
                (&local_d8,DrawList,&pIVar5->PlotRect);
      break;
    case 1:
      local_d8.Transformer = (TransformerLinLin *)&local_170;
      local_170.x = fVar4;
      local_d8.Getter = (GetterHeatmap<short> *)local_b8;
      local_d8.Prims = local_b8._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,ImPlot::TransformerLogLin>>
                ((RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLogLin> *)&local_d8,
                 DrawList,&pIVar5->PlotRect);
      break;
    case 2:
      local_d8.Transformer = (TransformerLinLin *)&local_170;
      local_170.x = fVar4;
      local_d8.Getter = (GetterHeatmap<short> *)local_b8;
      local_d8.Prims = local_b8._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,ImPlot::TransformerLinLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLinLog> *)&local_d8,
                 DrawList,&pIVar5->PlotRect);
      break;
    case 3:
      local_d8.Transformer = (TransformerLinLin *)&local_170;
      local_170.x = fVar4;
      local_d8.Getter = (GetterHeatmap<short> *)local_b8;
      local_d8.Prims = local_b8._8_4_;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<short>,ImPlot::TransformerLogLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<short>,_ImPlot::TransformerLogLog> *)&local_d8,
                 DrawList,&pIVar5->PlotRect);
    }
    if ((fmt != (char *)0x0) && (0 < rows)) {
      local_58 = (bounds_max->x - bounds_min->x) / (double)local_168._0_8_;
      local_130 = (bounds_max->y - bounds_min->y) / (double)local_168._8_8_;
      lVar13 = (long)transformer.YAxis;
      local_100 = (ulong)(uint)cols;
      local_138 = local_130 * 0.5;
      local_148 = local_58 * 0.5;
      local_110 = lVar13 << 4;
      local_118 = 0.0;
      local_14c = 0;
      local_150 = 0;
      uStack_50 = 0;
      local_158 = rows;
      local_154 = cols;
      local_128 = values;
      local_108 = lVar13;
      local_f8 = local_148;
      local_f0 = fmt;
      do {
        if (0 < cols) {
          local_e0 = (local_130 * local_118 + local_138) * dVar20 + local_120;
          local_e8 = values + local_150;
          local_168 = ZEXT816(0);
          lVar15 = 0;
          do {
            pIVar8 = GImPlot;
            local_148 = bounds_min->x + local_148;
            uStack_140 = 0;
            dVar18 = log10(local_e0 / GImPlot->CurrentPlot->YAxis[lVar13].Range.Min);
            psVar10 = local_e8;
            pIVar5 = pIVar8->CurrentPlot;
            dVar6 = pIVar5->YAxis[lVar13].Range.Min;
            uVar2 = *(undefined8 *)((long)&pIVar8->PixelRange[0].Min.x + local_110);
            local_148._0_4_ =
                 (float)(pIVar8->Mx *
                         ((local_148 + local_58 * (double)local_168._0_8_) -
                         (pIVar5->XAxis).Range.Min) + (double)(float)uVar2);
            local_148._4_4_ =
                 (float)(pIVar8->My[local_108] *
                         ((dVar6 + (double)(float)(dVar18 / pIVar8->LogDenY[local_108]) *
                                   (pIVar5->YAxis[lVar13].Range.Max - dVar6)) - dVar6) +
                        (double)(float)((ulong)uVar2 >> 0x20));
            uStack_140 = 0;
            sprintf((char *)&local_d8,local_f0,(ulong)(uint)(int)local_e8[lVar15]);
            IVar1 = ImGui::CalcTextSize((char *)&local_d8,(char *)0x0,false,-1.0);
            local_48._8_4_ = extraout_XMM0_Dc;
            local_48._0_4_ = IVar1.x;
            local_48._4_4_ = IVar1.y;
            local_48._12_4_ = extraout_XMM0_Dd;
            dVar6 = ((double)(int)psVar10[lVar15] - scale_min) / (scale_max - scale_min);
            dVar18 = 1.0;
            if (dVar6 <= 1.0) {
              dVar18 = dVar6;
            }
            IVar21 = SampleColormap((float)(double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar18),-1);
            local_170.y = (float)local_48._4_4_ * -0.5 + local_148._4_4_;
            local_170.x = (float)local_48._0_4_ * -0.5 + (float)local_148;
            ImDrawList::AddText(DrawList,&local_170,
                                -(uint)(IVar21.z * 0.114 + IVar21.x * 0.299 + IVar21.y * 0.587 <=
                                       0.5) | 0xff000000,(char *)&local_d8,(char *)0x0);
            uVar17 = local_168._12_4_;
            local_168._8_4_ = local_168._8_4_;
            local_168._0_8_ = local_168._0_8_ + 1.0;
            local_168._12_4_ = uVar17;
            lVar15 = lVar15 + 1;
            local_148 = local_f8;
          } while ((int)local_100 != (int)lVar15);
          local_150 = local_150 + (int)lVar15;
          values = local_128;
          rows = local_158;
          cols = local_154;
        }
        local_118 = local_118 + 1.0;
        local_14c = local_14c + 1;
      } while (local_14c != rows);
    }
  }
  else {
    dVar6 = log10(bounds_min->y / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
    pIVar9 = GImPlot;
    pIVar5 = pIVar8->CurrentPlot;
    dVar20 = pIVar5->YAxis[transformer.YAxis].Range.Min;
    IVar1 = pIVar8->PixelRange[transformer.YAxis].Min;
    local_168._0_8_ = DrawList;
    local_b8._4_4_ =
         (float)(pIVar8->My[transformer.YAxis] *
                 (((double)(float)(dVar6 / pIVar8->LogDenY[transformer.YAxis]) *
                   (pIVar5->YAxis[transformer.YAxis].Range.Max - dVar20) + dVar20) - dVar20) +
                (double)IVar1.y);
    local_b8._0_4_ =
         (float)(pIVar8->Mx * (bounds_min->x - (pIVar5->XAxis).Range.Min) + (double)IVar1.x);
    dVar6 = log10(bounds_max->y / GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
    pIVar5 = pIVar9->CurrentPlot;
    dVar20 = pIVar5->YAxis[transformer.YAxis].Range.Min;
    IVar1 = pIVar9->PixelRange[transformer.YAxis].Min;
    local_d8.Getter =
         (GetterHeatmap<short> *)
         CONCAT44((float)(pIVar9->My[transformer.YAxis] *
                          (((double)(float)(dVar6 / pIVar9->LogDenY[transformer.YAxis]) *
                            (pIVar5->YAxis[transformer.YAxis].Range.Max - dVar20) + dVar20) - dVar20
                          ) + (double)IVar1.y),
                  (float)(pIVar9->Mx * (bounds_max->x - (pIVar5->XAxis).Range.Min) + (double)IVar1.x
                         ));
    col = GetColormapColorU32(0,(pIVar8->Style).Colormap);
    ImDrawList::AddRectFilled
              ((ImDrawList *)local_168._0_8_,(ImVec2 *)local_b8,(ImVec2 *)&local_d8,col,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}